

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQInteger __thiscall SQSharedState::GetMetaMethodIdxByName(SQSharedState *this,SQObjectPtr *name)

{
  bool bVar1;
  SQObjectValue SVar2;
  SQObjectPtr ret;
  
  if ((name->super_SQObject)._type == OT_STRING) {
    ret.super_SQObject._type = OT_NULL;
    ret.super_SQObject._unVal.pTable = (SQTable *)0x0;
    bVar1 = SQTable::Get((this->_metamethodsmap).super_SQObject._unVal.pTable,name,&ret);
    SVar2 = ret.super_SQObject._unVal;
    if (!bVar1) {
      SVar2.nInteger = -1;
    }
    SQObjectPtr::~SQObjectPtr(&ret);
  }
  else {
    SVar2.nInteger = -1;
  }
  return (SQInteger)SVar2.pTable;
}

Assistant:

SQInteger SQSharedState::GetMetaMethodIdxByName(const SQObjectPtr &name)
{
    if(type(name) != OT_STRING)
        return -1;
    SQObjectPtr ret;
    if(_table(_metamethodsmap)->Get(name,ret)) {
        return _integer(ret);
    }
    return -1;
}